

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O0

Real __thiscall
amrex::MLCellLinOp::xdoty
          (MLCellLinOp *this,int param_2,int param_3,MultiFab *x,MultiFab *y,bool local)

{
  long *in_RDI;
  byte in_R9B;
  Real RVar1;
  Real result;
  int nghost;
  int ncomp;
  bool in_stack_00000143;
  int in_stack_00000144;
  int in_stack_00000148;
  int in_stack_0000014c;
  MultiFab *in_stack_00000150;
  int in_stack_0000015c;
  MultiFab *in_stack_00000160;
  MPI_Comm in_stack_ffffffffffffffbc;
  double *in_stack_ffffffffffffffc0;
  
  (**(code **)(*in_RDI + 0x28))();
  RVar1 = MultiFab::Dot(in_stack_00000160,in_stack_0000015c,in_stack_00000150,in_stack_0000014c,
                        in_stack_00000148,in_stack_00000144,in_stack_00000143);
  if ((in_R9B & 1) == 0) {
    ParallelContext::CommunicatorSub();
    ParallelAllReduce::Sum<double>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  return RVar1;
}

Assistant:

Real
MLCellLinOp::xdoty (int /*amrlev*/, int /*mglev*/, const MultiFab& x, const MultiFab& y, bool local) const
{
    const int ncomp = getNComp();
    const int nghost = 0;
    Real result = MultiFab::Dot(x,0,y,0,ncomp,nghost,true);
    if (!local) {
        ParallelAllReduce::Sum(result, ParallelContext::CommunicatorSub());
    }
    return result;
}